

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VmaAllocation_T * __thiscall
VmaPoolAllocator<VmaAllocation_T>::Alloc<bool_const&>
          (VmaPoolAllocator<VmaAllocation_T> *this,bool *args)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  ItemBlock *pIVar4;
  Item *pIVar5;
  uint32_t uVar6;
  ulong uVar7;
  
  sVar2 = (this->m_ItemBlocks).m_Count;
  lVar3 = sVar2 + 1;
  pIVar4 = (this->m_ItemBlocks).m_pArray + sVar2;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      pIVar4 = CreateNewBlock(this);
      pIVar5 = pIVar4->pItems;
      uVar6 = pIVar5->NextFreeIndex;
      goto LAB_001c434d;
    }
    uVar7 = (ulong)pIVar4[-1].FirstFreeIndex;
    pIVar4 = pIVar4 + -1;
  } while (uVar7 == 0xffffffff);
  pIVar5 = pIVar4->pItems + uVar7;
  uVar6 = pIVar4->pItems[uVar7].NextFreeIndex;
LAB_001c434d:
  pIVar4->FirstFreeIndex = uVar6;
  bVar1 = *args;
  *(char *)((long)pIVar5 + 0x28) = '\x01';
  *(char *)((long)pIVar5 + 0x29) = '\0';
  *(char *)((long)pIVar5 + 0x2a) = '\0';
  *(char *)((long)pIVar5 + 0x2b) = '\0';
  *(char *)((long)pIVar5 + 0x2c) = '\0';
  *(char *)((long)pIVar5 + 0x2d) = '\0';
  *(char *)((long)pIVar5 + 0x2e) = '\0';
  *(char *)((long)pIVar5 + 0x2f) = '\0';
  *(char *)((long)pIVar5 + 0x30) = '\0';
  *(char *)((long)pIVar5 + 0x31) = '\0';
  *(char *)((long)pIVar5 + 0x32) = '\0';
  *(char *)((long)pIVar5 + 0x33) = '\0';
  *(char *)((long)pIVar5 + 0x34) = '\0';
  *(char *)((long)pIVar5 + 0x35) = '\0';
  *(char *)((long)pIVar5 + 0x36) = '\0';
  *(char *)((long)pIVar5 + 0x37) = '\0';
  *(char *)((long)pIVar5 + 0x38) = '\0';
  *(char *)((long)pIVar5 + 0x39) = '\0';
  *(char *)((long)pIVar5 + 0x3a) = '\0';
  *(char *)((long)pIVar5 + 0x3b) = '\0';
  *(char *)((long)pIVar5 + 0x3c) = '\0';
  *(char *)((long)pIVar5 + 0x3d) = '\0';
  *(char *)((long)pIVar5 + 0x3e) = '\0';
  *(char *)((long)pIVar5 + 0x3f) = '\0';
  *(char *)((long)pIVar5 + 0x3d) = '\0';
  *(char *)((long)pIVar5 + 0x3e) = '\0';
  *(char *)((long)pIVar5 + 0x3f) = '\0';
  *(char *)((long)pIVar5 + 0x40) = '\0';
  *(char *)((long)pIVar5 + 0x41) = '\0';
  *(char *)((long)pIVar5 + 0x42) = '\0';
  *(char *)((long)pIVar5 + 0x43) = '\0';
  *(char *)((long)pIVar5 + 0x44) = '\0';
  *(char *)((long)pIVar5 + 0x45) = '\0';
  *(char *)((long)pIVar5 + 0x46) = '\0';
  *(char *)((long)pIVar5 + 0x47) = '\0';
  *(char *)((long)pIVar5 + 0x48) = '\0';
  *(char *)((long)pIVar5 + 0x49) = '\0';
  *(char *)((long)pIVar5 + 0x4a) = '\0';
  *(char *)((long)pIVar5 + 0x4b) = '\0';
  *(char *)((long)pIVar5 + 0x4c) = '\0';
  *(char *)((long)pIVar5 + 0x4d) = '\x01';
  *(char *)((long)pIVar5 + 0x4e) = '\0';
  pIVar5->Value[0x4f] = bVar1 * '\x02';
  *(char *)((long)pIVar5 + 0x50) = '\0';
  *(char *)((long)pIVar5 + 0x51) = '\0';
  *(char *)((long)pIVar5 + 0x52) = '\0';
  *(char *)((long)pIVar5 + 0x53) = '\0';
  return (VmaAllocation_T *)pIVar5;
}

Assistant:

T* VmaPoolAllocator<T>::Alloc(Types&&... args)
{
    for (size_t i = m_ItemBlocks.size(); i--; )
    {
        ItemBlock& block = m_ItemBlocks[i];
        // This block has some free items: Use first one.
        if (block.FirstFreeIndex != UINT32_MAX)
        {
            Item* const pItem = &block.pItems[block.FirstFreeIndex];
            block.FirstFreeIndex = pItem->NextFreeIndex;
            T* result = (T*)&pItem->Value;
            new(result)T(std::forward<Types>(args)...); // Explicit constructor call.
            return result;
        }
    }

    // No block has free item: Create new one and use it.
    ItemBlock& newBlock = CreateNewBlock();
    Item* const pItem = &newBlock.pItems[0];
    newBlock.FirstFreeIndex = pItem->NextFreeIndex;
    T* result = (T*)&pItem->Value;
    new(result) T(std::forward<Types>(args)...); // Explicit constructor call.
    return result;
}